

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall
QAbstractItemView::dataChanged
          (QAbstractItemView *this,QModelIndex *topLeft,QModelIndex *bottomRight,QList<int> *roles)

{
  SizeAdjustPolicy SVar1;
  QAbstractItemViewPrivate *this_00;
  QAbstractItemModel *pQVar2;
  Data *pDVar3;
  QWidgetData *pQVar4;
  QDebug QVar5;
  undefined8 this_01;
  char cVar6;
  QEditorInfo *pQVar7;
  long *plVar8;
  long lVar9;
  QObject *pQVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QDebug local_a8;
  undefined1 local_a0 [24];
  undefined1 local_88 [8];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_80;
  long local_78;
  long lStack_70;
  QRect local_68;
  undefined8 uStack_58;
  char *local_50;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  if ((((topLeft->r == bottomRight->r) && (topLeft->c == bottomRight->c)) &&
      (topLeft->i == bottomRight->i)) &&
     ((pQVar2 = (bottomRight->m).ptr, (topLeft->m).ptr == pQVar2 &&
      (pQVar2 != (QAbstractItemModel *)0x0 && -1 < (topLeft->r | topLeft->c))))) {
    pQVar7 = QAbstractItemViewPrivate::editorForIndex(this_00,topLeft);
    if ((((pQVar7->isStatic == false) && (pDVar3 = (pQVar7->widget).wp.d, pDVar3 != (Data *)0x0)) &&
        (*(int *)(pDVar3 + 4) != 0)) && ((pQVar7->widget).wp.value != (QObject *)0x0)) {
      plVar8 = (long *)(**(code **)(*(long *)this + 0x208))(this,topLeft);
      if (plVar8 != (long *)0x0) {
        pDVar3 = (pQVar7->widget).wp.d;
        if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
          pQVar10 = (QObject *)0x0;
        }
        else {
          pQVar10 = (pQVar7->widget).wp.value;
        }
        (**(code **)(*plVar8 + 0x80))(plVar8,pQVar10,topLeft);
      }
    }
    if (((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) != 0) &&
       (this_00->delayedPendingLayout == false)) {
      update(this,topLeft);
    }
    goto LAB_00539c0b;
  }
  QAbstractItemViewPrivate::updateEditorData(this_00,topLeft,bottomRight);
  if (((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) == 0) ||
     (this_00->delayedPendingLayout != false)) goto LAB_00539c0b;
  if (((topLeft->r < 0) || (topLeft->c < 0)) ||
     (pQVar2 = (topLeft->m).ptr, pQVar2 == (QAbstractItemModel *)0x0)) {
LAB_00539a3d:
    local_68.x1.m_i = 2;
    local_68.y1.m_i = 0;
    local_68.x2.m_i = 0;
    local_68.y2.m_i = 0;
    uStack_58._0_4_ = 0;
    uStack_58._4_4_ = 0;
    local_50 = "default";
    QMessageLogger::warning();
    QVar5.stream = local_a8.stream;
    *(QTextStream *)(local_a8.stream + 0x30) = (QTextStream)0x0;
    QVar12.m_data = (storage_type *)0x31;
    QVar12.m_size = (qsizetype)&local_80;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<((QTextStream *)QVar5.stream,(QString *)&local_80);
    if ((QArrayData *)local_80.ptr != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_80.ptr = *(int *)local_80.ptr + -1;
      UNLOCK();
      if (*(int *)local_80.ptr == 0) {
        QArrayData::deallocate((QArrayData *)local_80.ptr,2,0x10);
      }
    }
    if (*(QTextStream *)(local_a8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_a8.stream,' ');
    }
    QVar5.stream = local_a8.stream;
    QVar13.m_data = (storage_type *)0xe;
    QVar13.m_size = (qsizetype)&local_80;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<((QTextStream *)QVar5.stream,(QString *)&local_80);
    if ((QArrayData *)local_80.ptr != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_80.ptr = *(int *)local_80.ptr + -1;
      UNLOCK();
      if (*(int *)local_80.ptr == 0) {
        QArrayData::deallocate((QArrayData *)local_80.ptr,2,0x10);
      }
    }
    if (*(QTextStream *)(local_a8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_a8.stream,' ');
    }
    *(int *)((QTextStream *)local_a8.stream + 0x28) =
         *(int *)((QTextStream *)local_a8.stream + 0x28) + 1;
    ::operator<<((Stream *)(local_a0 + 8),(QModelIndex *)local_a0);
    this_01 = local_a0._8_8_;
    QVar14.m_data = (storage_type *)0x11;
    QVar14.m_size = (qsizetype)&local_80;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<((QTextStream *)this_01,(QString *)&local_80);
    if ((QArrayData *)local_80.ptr != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_80.ptr = *(int *)local_80.ptr + -1;
      UNLOCK();
      if (*(int *)local_80.ptr == 0) {
        QArrayData::deallocate((QArrayData *)local_80.ptr,2,0x10);
      }
    }
    if (*(QTextStream *)(local_a0._8_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_a0._8_8_,' ');
    }
    *(int *)(local_a0._8_8_ + 0x28) = *(int *)(local_a0._8_8_ + 0x28) + 1;
    ::operator<<((Stream *)local_88,(QModelIndex *)(local_a0 + 0x10));
    QDebug::~QDebug((QDebug *)local_88);
    QDebug::~QDebug((QDebug *)(local_a0 + 0x10));
    QDebug::~QDebug((QDebug *)(local_a0 + 8));
    QDebug::~QDebug((QDebug *)local_a0);
    QDebug::~QDebug(&local_a8);
  }
  else {
    (**(code **)(*(long *)pQVar2 + 0x68))(&local_68,pQVar2,topLeft);
    pQVar2 = (bottomRight->m).ptr;
    if (pQVar2 == (QAbstractItemModel *)0x0) {
      local_80.ptr = (QAbstractItemModel *)0xffffffffffffffff;
      local_78 = 0;
      lStack_70 = 0;
      local_80.ptr._0_4_ = -1;
    }
    else {
      (**(code **)(*(long *)pQVar2 + 0x68))(&local_80,pQVar2,bottomRight);
    }
    if (((((local_68.x1.m_i != (int)local_80.ptr) || (local_68.y1.m_i != local_80.ptr._4_4_)) ||
         (CONCAT44(local_68.y2.m_i,local_68.x2.m_i) != local_78)) ||
        ((CONCAT44(uStack_58._4_4_,(undefined4)uStack_58) != lStack_70 ||
         (bottomRight->r < topLeft->r)))) || (bottomRight->c < topLeft->c)) goto LAB_00539a3d;
    lVar9 = ((long)(bottomRight->c - topLeft->c) + 1) * ((long)(bottomRight->r - topLeft->r) + 1);
    if (lVar9 - this_00->updateThreshold == 0 || lVar9 < this_00->updateThreshold) {
      pQVar4 = ((this_00->super_QAbstractScrollAreaPrivate).viewport)->data;
      auVar11 = (**(code **)(*(long *)&(this_00->super_QAbstractScrollAreaPrivate).
                                       super_QFramePrivate.super_QWidgetPrivate + 0x108))
                          (this_00,0,
                           CONCAT44((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i,
                                    (pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i),topLeft,
                           bottomRight);
      local_68.x1.m_i = auVar11._0_4_;
      local_68.y1.m_i = auVar11._4_4_;
      local_68.x2.m_i = auVar11._8_4_;
      local_68.y2.m_i = auVar11._12_4_;
      if ((local_68.x1.m_i <= local_68.x2.m_i) && (local_68.y1.m_i <= local_68.y2.m_i)) {
        QWidget::update((this_00->super_QAbstractScrollAreaPrivate).viewport,&local_68);
      }
      goto LAB_00539c0b;
    }
  }
  QWidget::update((this_00->super_QAbstractScrollAreaPrivate).viewport);
LAB_00539c0b:
  cVar6 = QAccessible::isActive();
  if (cVar6 != '\0') {
    local_68.y2.m_i = -0x55555556;
    local_50 = (char *)0x1ffffffff;
    local_68.x1.m_i = 0x82f168;
    local_68.y1.m_i = 0;
    local_68.x2.m_i = 0x116;
    local_48 = topLeft->r;
    iStack_44 = topLeft->c;
    iStack_40 = bottomRight->r;
    iStack_3c = bottomRight->c;
    uStack_58 = this;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_68);
    QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent
              ((QAccessibleTableModelChangeEvent *)&local_68);
  }
  SVar1 = (this_00->super_QAbstractScrollAreaPrivate).sizeAdjustPolicy;
  if ((SVar1 != AdjustIgnored) &&
     ((SVar1 == AdjustToContents || ((this_00->super_QAbstractScrollAreaPrivate).shownOnce == false)
      ))) {
    QWidget::updateGeometry
              (*(QWidget **)
                &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                 super_QWidgetPrivate.field_0x8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::dataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight,
                                    const QList<int> &roles)
{
    Q_UNUSED(roles);
    // Single item changed
    Q_D(QAbstractItemView);
    if (topLeft == bottomRight && topLeft.isValid()) {
        const QEditorInfo &editorInfo = d->editorForIndex(topLeft);
        //we don't update the edit data if it is static
        if (!editorInfo.isStatic && editorInfo.widget) {
            QAbstractItemDelegate *delegate = itemDelegateForIndex(topLeft);
            if (delegate) {
                delegate->setEditorData(editorInfo.widget.data(), topLeft);
            }
        }
        if (isVisible() && !d->delayedPendingLayout) {
            // otherwise the items will be updated later anyway
            update(topLeft);
        }
    } else {
        d->updateEditorData(topLeft, bottomRight);
        if (isVisible() && !d->delayedPendingLayout) {
            if (!topLeft.isValid() ||
                topLeft.parent() != bottomRight.parent() ||
                topLeft.row() > bottomRight.row() ||
                topLeft.column() > bottomRight.column()) {
                // invalid parameter - call update() to redraw all
                qWarning().nospace() << "dataChanged() called with an invalid index range:"
                                     << "\n    topleft: " << topLeft
                                     << "\n    bottomRight:" << bottomRight;
                d->viewport->update();
            } else if ((bottomRight.row() - topLeft.row() + 1LL) *
                       (bottomRight.column() - topLeft.column() + 1LL) > d->updateThreshold) {
                // too many indices to check - force full update
                d->viewport->update();
            } else {
                const QRect updateRect = d->intersectedRect(d->viewport->rect(), topLeft, bottomRight);
                if (!updateRect.isEmpty())
                    d->viewport->update(updateRect);
            }
        }
    }

#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent accessibleEvent(this, QAccessibleTableModelChangeEvent::DataChanged);
        accessibleEvent.setFirstRow(topLeft.row());
        accessibleEvent.setFirstColumn(topLeft.column());
        accessibleEvent.setLastRow(bottomRight.row());
        accessibleEvent.setLastColumn(bottomRight.column());
        QAccessible::updateAccessibility(&accessibleEvent);
    }
#endif
    d->updateGeometry();
}